

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic.cpp
# Opt level: O0

void mxv(Type (*result) [1500],Type (*mx) [1500] [6000],Type (*v) [6000])

{
  int j;
  int i;
  Type (*v_local) [6000];
  Type (*mx_local) [1500] [6000];
  Type (*result_local) [1500];
  
  for (i = 0; i < 0x5dc; i = i + 1) {
    (*result)[i] = 0.0;
    for (j = 0; j < 6000; j = j + 1) {
      (*result)[i] = (*mx)[i][j] * (*v)[j] + (*result)[i];
    }
  }
  return;
}

Assistant:

void mxv(Type (& result)[BCK], const Type (& mx)[BCK][N], const Type (&v) [N])
{  
  for(int i = 0; i < BCK; i++) {
    result[i] = (Type)0;
    for(int j = 0; j < N; j++)
      result[i] += mx[i][j] * v[j];
  }
}